

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_GenerateRandom
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pRandomData,CK_ULONG ulRandomLen)

{
  byte bVar1;
  int iVar2;
  CK_VOID_PTR pvVar3;
  CryptoFactory *pCVar4;
  undefined4 extraout_var;
  uchar *__src;
  size_t in_RCX;
  ByteString *in_RDX;
  long in_RDI;
  ByteString randomData;
  RNG *rng;
  Session *session;
  undefined1 local_60 [16];
  CK_SESSION_HANDLE in_stack_ffffffffffffffb0;
  HandleManager *in_stack_ffffffffffffffb8;
  CK_RV local_8;
  long *plVar5;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == (ByteString *)0x0) {
    local_8 = 7;
  }
  else {
    pvVar3 = HandleManager::getSession(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (pvVar3 == (CK_VOID_PTR)0x0) {
      local_8 = 0xb3;
    }
    else {
      pCVar4 = CryptoFactory::i();
      iVar2 = (*pCVar4->_vptr_CryptoFactory[8])(pCVar4,1);
      plVar5 = (long *)CONCAT44(extraout_var,iVar2);
      if (plVar5 == (long *)0x0) {
        local_8 = 5;
      }
      else {
        ByteString::ByteString((ByteString *)0x196e22);
        bVar1 = (**(code **)(*plVar5 + 0x10))(plVar5,local_60,in_RCX);
        if ((bVar1 & 1) == 0) {
          local_8 = 5;
        }
        else {
          if (in_RCX != 0) {
            __src = ByteString::byte_str(in_RDX);
            memcpy(in_RDX,__src,in_RCX);
          }
          local_8 = 0;
        }
        ByteString::~ByteString((ByteString *)0x196ecd);
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_GenerateRandom(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pRandomData, CK_ULONG ulRandomLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pRandomData == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the RNG
	RNG* rng = CryptoFactory::i()->getRNG();
	if (rng == NULL) return CKR_GENERAL_ERROR;

	// Generate random data
	ByteString randomData;
	if (!rng->generateRandom(randomData, ulRandomLen)) return CKR_GENERAL_ERROR;

	// Return random data
	if (ulRandomLen != 0)
	{
		memcpy(pRandomData, randomData.byte_str(), ulRandomLen);
	}

	return CKR_OK;
}